

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O2

int SUNLinSolSolve_SPGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  double *pdVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  code *pcVar16;
  code *pcVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  double *pdVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  ulong local_100;
  double local_68;
  double local_48;
  
  puVar5 = (uint *)S->content;
  uVar1 = *puVar5;
  uVar2 = puVar5[2];
  uVar3 = puVar5[3];
  puVar6 = *(undefined8 **)(puVar5 + 0x18);
  lVar7 = *(long *)(puVar5 + 0x1a);
  lVar8 = *(long *)(puVar5 + 0x1c);
  uVar9 = *(undefined8 *)(puVar5 + 0x1e);
  pdVar10 = *(double **)(puVar5 + 0x20);
  uVar11 = *(undefined8 *)(puVar5 + 0x22);
  lVar12 = *(long *)(puVar5 + 0x14);
  lVar13 = *(long *)(puVar5 + 0x16);
  uVar14 = *(undefined8 *)(puVar5 + 0xc);
  uVar15 = *(undefined8 *)(puVar5 + 0x12);
  pcVar16 = *(code **)(puVar5 + 10);
  pcVar17 = *(code **)(puVar5 + 0x10);
  puVar18 = *(undefined8 **)(puVar5 + 0x24);
  puVar19 = *(undefined8 **)(puVar5 + 0x26);
  puVar5[5] = 0;
  uVar4 = puVar5[1];
  if (puVar5[4] == 0) {
    iVar21 = (*pcVar16)(uVar14,x,uVar11);
    if (iVar21 == 0) {
      N_VLinearSum(0x3ff0000000000000,b,uVar11,uVar11);
      goto LAB_0012cf96;
    }
    puVar5[4] = 0;
LAB_0012d581:
    iVar27 = -0x325;
    iVar22 = 0x323;
LAB_0012d58d:
    if (iVar21 < 0) {
      iVar22 = iVar27;
    }
  }
  else {
    N_VScale(0x3ff0000000000000,b,uVar11);
LAB_0012cf96:
    N_VScale(0x3ff0000000000000,uVar11,*puVar6);
    uVar20 = uVar4 | 2;
    if (uVar20 == 3) {
      iVar21 = (*pcVar17)(delta,uVar15,*puVar6,uVar11);
      if (iVar21 != 0) {
        puVar5[4] = 0;
LAB_0012cfdc:
        iVar27 = -0x328;
        iVar22 = 0x325;
        goto LAB_0012d58d;
      }
    }
    else {
      N_VScale(0x3ff0000000000000,*puVar6,uVar11);
    }
    if (lVar12 == 0) {
      N_VScale(0x3ff0000000000000,uVar11,*puVar6);
    }
    else {
      N_VProd(lVar12,uVar11);
    }
    dVar33 = (double)N_VDotProd(*puVar6,*puVar6);
    dVar35 = 0.0;
    if (0.0 < dVar33) {
      if (dVar33 < 0.0) {
        dVar35 = sqrt(dVar33);
      }
      else {
        dVar35 = SQRT(dVar33);
      }
    }
    *(double *)(puVar5 + 6) = dVar35;
    if (delta < dVar35) {
      uVar30 = (ulong)uVar1;
      N_VConst(0,uVar9);
      uVar4 = uVar4 & 0xfffffffe;
      local_100 = 0;
      uVar24 = 0;
      if (0 < (int)uVar1) {
        uVar24 = (ulong)uVar1;
      }
      dVar33 = dVar35;
      local_48 = dVar35;
      for (uVar23 = 0; lVar31 = 4, (int)uVar23 <= (int)uVar3; uVar23 = uVar23 + 1) {
        for (lVar25 = 0; lVar25 <= (int)uVar1; lVar25 = lVar25 + 1) {
          for (uVar28 = 0; uVar30 != uVar28; uVar28 = uVar28 + 1) {
            *(undefined8 *)(*(long *)(lVar7 + lVar25 * 8) + uVar28 * 8) = 0;
          }
        }
        local_68 = 1.0;
        uVar28 = 0;
        dVar34 = dVar33;
        while (N_VScale(1.0 / dVar34,puVar6[uVar28],puVar6[uVar28]), uVar24 != uVar28) {
          puVar5[5] = puVar5[5] + 1;
          if (lVar13 == 0) {
            N_VScale(0x3ff0000000000000,puVar6[uVar28],uVar11);
          }
          else {
            N_VDiv(puVar6[uVar28],lVar13,uVar11);
          }
          if (uVar4 == 2) {
            N_VScale(0x3ff0000000000000,uVar11,puVar6[uVar28 + 1]);
            iVar21 = (*pcVar17)(delta,uVar15,puVar6[uVar28 + 1],uVar11,2);
            if (iVar21 == 0) goto LAB_0012d223;
LAB_0012d56a:
            puVar5[4] = 0;
            goto LAB_0012cfdc;
          }
LAB_0012d223:
          iVar21 = (*pcVar16)(uVar14,uVar11,puVar6[uVar28 + 1]);
          if (iVar21 != 0) {
            puVar5[4] = 0;
            goto LAB_0012d581;
          }
          if (uVar20 == 3) {
            iVar21 = (*pcVar17)(delta,uVar15,puVar6[uVar28 + 1],uVar11,1);
            if (iVar21 != 0) goto LAB_0012d56a;
          }
          else {
            N_VScale(0x3ff0000000000000,puVar6[uVar28 + 1],uVar11);
          }
          if (lVar12 == 0) {
            N_VScale(0x3ff0000000000000,uVar11,puVar6[uVar28 + 1]);
          }
          else {
            N_VProd(lVar12,uVar11);
          }
          local_100 = uVar28 + 1;
          lVar25 = *(long *)(lVar7 + 8 + uVar28 * 8) + lVar31 + -4;
          if (uVar2 == 2) {
            SUNClassicalGS(puVar6,lVar7,local_100 & 0xffffffff,uVar30,lVar25,puVar18,puVar19);
          }
          else {
            SUNModifiedGS(puVar6,lVar7,local_100 & 0xffffffff,uVar30,lVar25);
          }
          iVar21 = SUNQRfact(local_100 & 0xffffffff,lVar7,lVar8,uVar28 & 0xffffffff);
          if (iVar21 != 0) {
            puVar5[4] = 0;
            iVar22 = 0x327;
            goto LAB_0012d595;
          }
          local_68 = local_68 * *(double *)(lVar8 + lVar31 * 2);
          local_48 = ABS(dVar33 * local_68);
          *(double *)(puVar5 + 6) = local_48;
          if (local_48 <= delta) {
            local_100 = (ulong)((int)uVar28 + 1);
            break;
          }
          dVar34 = *(double *)(*(long *)(lVar7 + 8 + uVar28 * 8) + uVar28 * 8);
          lVar31 = lVar31 + 8;
          uVar28 = local_100;
        }
        *pdVar10 = dVar33;
        iVar21 = (int)local_100;
        uVar32 = 0;
        if (0 < iVar21) {
          uVar32 = local_100 & 0xffffffff;
        }
        for (uVar26 = 0; uVar32 != uVar26; uVar26 = uVar26 + 1) {
          pdVar10[uVar26 + 1] = 0.0;
        }
        iVar22 = SUNQRsol(local_100,lVar7,lVar8);
        if (iVar22 != 0) {
          puVar5[4] = 0;
          iVar22 = -0x32b;
          goto LAB_0012d595;
        }
        *puVar18 = 0x3ff0000000000000;
        *puVar19 = uVar9;
        for (uVar26 = 0; uVar32 != uVar26; uVar26 = uVar26 + 1) {
          puVar18[uVar26 + 1] = pdVar10[uVar26];
          puVar19[uVar26 + 1] = puVar6[uVar26];
        }
        N_VLinearCombination(iVar21 + 1,puVar18,puVar19,uVar9);
        if ((long)uVar28 < (long)(int)uVar1) {
          if (lVar13 != 0) {
            N_VDiv(uVar9,lVar13,uVar9);
          }
          if (uVar4 == 2) {
            iVar21 = (*pcVar17)(delta,uVar15,uVar9,uVar11,2);
            if (iVar21 != 0) goto LAB_0012d67d;
          }
          else {
            N_VScale(0x3ff0000000000000,uVar9,uVar11);
          }
          if (puVar5[4] == 0) {
            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,x,uVar11,x);
          }
          else {
            N_VScale(0x3ff0000000000000,uVar11,x);
          }
          puVar5[4] = 0;
          iVar22 = 0;
          goto LAB_0012d595;
        }
        if (uVar23 == uVar3) break;
        uVar28 = local_100 & 0xffffffff;
        pdVar29 = (double *)(uVar28 * 0x10 + lVar8 + -8);
        dVar34 = 1.0;
        for (; 0 < (int)uVar28; uVar28 = uVar28 - 1) {
          pdVar10[uVar28] = pdVar29[-1] * dVar34;
          dVar34 = dVar34 * *pdVar29;
          pdVar29 = pdVar29 + -2;
        }
        *pdVar10 = dVar34;
        for (lVar31 = 0; lVar31 <= iVar21; lVar31 = lVar31 + 1) {
          pdVar10[lVar31] = pdVar10[lVar31] * dVar33 * dVar34;
        }
        for (lVar31 = 0; lVar31 <= iVar21; lVar31 = lVar31 + 1) {
          puVar18[lVar31] = pdVar10[lVar31];
          puVar19[lVar31] = puVar6[lVar31];
        }
        dVar33 = ABS(dVar33 * dVar34);
        N_VLinearCombination(iVar21 + 1);
      }
      if (dVar35 <= local_48) {
        puVar5[4] = 0;
        iVar22 = 0x322;
      }
      else {
        if (lVar13 != 0) {
          N_VDiv(uVar9,lVar13,uVar9);
        }
        if (uVar4 == 2) {
          iVar21 = (*pcVar17)(delta,uVar15,uVar9,uVar11,2);
          if (iVar21 != 0) {
LAB_0012d67d:
            puVar5[4] = 0;
            iVar22 = 0x325;
            if (iVar21 < 0) {
              iVar22 = -0x328;
            }
            goto LAB_0012d595;
          }
        }
        else {
          N_VScale(0x3ff0000000000000,uVar9,uVar11);
        }
        if (puVar5[4] == 0) {
          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,x,uVar11,x);
        }
        else {
          N_VScale(0x3ff0000000000000,uVar11,x);
        }
        puVar5[4] = 0;
        iVar22 = 0x321;
      }
    }
    else {
      puVar5[4] = 0;
      iVar22 = 0;
    }
  }
LAB_0012d595:
  *(int *)((long)S->content + 0x20) = iVar22;
  return iVar22;
}

Assistant:

int SUNLinSolSolve_SPGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                         N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  N_Vector *V, xcor, vtemp, s1, s2;
  sunrealtype **Hes, *givens, *yg, *res_norm;
  sunrealtype beta, rotation_product, r_norm, s_product, rho;
  sunbooleantype preOnLeft, preOnRight, scale2, scale1, converged;
  sunbooleantype* zeroguess;
  int i, j, k, l, l_plus_1, l_max, krydim, ntries, max_restarts, gstype;
  int* nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* cv;
  N_Vector* Xv;
  int status;

  /* Initialize some variables */
  l_plus_1 = 0;
  krydim   = 0;

  /* Make local shorcuts to solver variables. */
  l_max        = SPGMR_CONTENT(S)->maxl;
  max_restarts = SPGMR_CONTENT(S)->max_restarts;
  gstype       = SPGMR_CONTENT(S)->gstype;
  V            = SPGMR_CONTENT(S)->V;
  Hes          = SPGMR_CONTENT(S)->Hes;
  givens       = SPGMR_CONTENT(S)->givens;
  xcor         = SPGMR_CONTENT(S)->xcor;
  yg           = SPGMR_CONTENT(S)->yg;
  vtemp        = SPGMR_CONTENT(S)->vtemp;
  s1           = SPGMR_CONTENT(S)->s1;
  s2           = SPGMR_CONTENT(S)->s2;
  A_data       = SPGMR_CONTENT(S)->ATData;
  P_data       = SPGMR_CONTENT(S)->PData;
  atimes       = SPGMR_CONTENT(S)->ATimes;
  psolve       = SPGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPGMR_CONTENT(S)->zeroguess);
  nli          = &(SPGMR_CONTENT(S)->numiters);
  res_norm     = &(SPGMR_CONTENT(S)->resnorm);
  cv           = SPGMR_CONTENT(S)->cv;
  Xv           = SPGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* Set sunbooleantype flags for internal solver options */
  preOnLeft  = ((SPGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
               (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  preOnRight = ((SPGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale1     = (s1 != NULL);
  scale2     = (s2 != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, vtemp);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, vtemp);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
    SUNCheckLastErr();
  }
  N_VScale(ONE, vtemp, V[0]);
  SUNCheckLastErr();

  /* Apply left preconditioner and left scaling to V[0] = r_0 */
  if (preOnLeft)
  {
    status = psolve(P_data, V[0], vtemp, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, V[0], vtemp);
    SUNCheckLastErr();
  }

  if (scale1)
  {
    N_VProd(s1, vtemp, V[0]);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp, V[0]);
    SUNCheckLastErr();
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 P1_inv r_0, and
     return if small  */
  r_norm = N_VDotProd(V[0], V[0]);
  SUNCheckLastErr();
  *res_norm = r_norm = beta = SUNRsqrt(r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNLinSolSolve_SPGMR", "initial-residual",
                     "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0 */
  N_VConst(ZERO, xcor);
  SUNCheckLastErr();

  /* Begin outer iterations: up to (max_restarts + 1) attempts */
  for (ntries = 0; ntries <= max_restarts; ntries++)
  {
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0] */
    for (i = 0; i <= l_max; i++)
    {
      for (j = 0; j < l_max; j++) { Hes[i][j] = ZERO; }
    }

    rotation_product = ONE;
    N_VScale(ONE / r_norm, V[0], V[0]);
    SUNCheckLastErr();

    /* Inner loop: generate Krylov sequence and Arnoldi basis */
    for (l = 0; l < l_max; l++)
    {
      (*nli)++;
      krydim = l_plus_1 = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 P1_inv A P2_inv s2_inv */

      /*   Apply right scaling: vtemp = s2_inv V[l] */
      if (scale2)
      {
        N_VDiv(V[l], s2, vtemp);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, V[l], vtemp);
        SUNCheckLastErr();
      }

      /*   Apply right preconditioner: vtemp = P2_inv s2_inv V[l] */
      if (preOnRight)
      {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
        status = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;
          return (LASTFLAG(S));
        }
      }

      /* Apply A: V[l+1] = A P2_inv s2_inv V[l] */
      status = atimes(A_data, vtemp, V[l_plus_1]);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                   : SUNLS_ATIMES_FAIL_REC;
        return (LASTFLAG(S));
      }

      /* Apply left preconditioning: vtemp = P1_inv A P2_inv s2_inv V[l] */
      if (preOnLeft)
      {
        status = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_LEFT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;
          return (LASTFLAG(S));
        }
      }
      else
      {
        N_VScale(ONE, V[l_plus_1], vtemp);
        SUNCheckLastErr();
      }

      /* Apply left scaling: V[l+1] = s1 P1_inv A P2_inv s2_inv V[l] */
      if (scale1)
      {
        N_VProd(s1, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
      }

      /*  Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde */
      if (gstype == SUN_CLASSICAL_GS)
      {
        SUNCheckCall(
          SUNClassicalGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l]), cv, Xv));
      }
      else
      {
        SUNCheckCall(SUNModifiedGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l])));
      }

      /*  Update the QR factorization of Hes */
      if (SUNQRfact(krydim, Hes, givens, l) != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return (LASTFLAG(S));
      }

      /*  Update residual norm estimate; break if convergence test passes */
      rotation_product *= givens[2 * l + 1];
      *res_norm = rho = SUNRabs(rotation_product * r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                         "SUNLinSolSolve_SPGMR", "iterate-residual",
                         "nli = %li, resnorm = %.16g", (long int)*nli, *res_norm);
#endif

      if (rho <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine */
      N_VScale(ONE / Hes[l_plus_1][l], V[l_plus_1], V[l_plus_1]);
      SUNCheckLastErr();
    }

    /* Inner loop is done.  Compute the new correction vector xcor */

    /*   Construct g, then solve for y */
    yg[0] = r_norm;
    for (i = 1; i <= krydim; i++) { yg[i] = ZERO; }
    if (SUNQRsol(krydim, Hes, givens, yg) != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return (LASTFLAG(S));
    }

    /*   Add correction vector V_l y to xcor */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k = 0; k < krydim; k++)
    {
      cv[k + 1] = yg[k];
      Xv[k + 1] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, xcor));

    /* If converged, construct the final solution vector x and return */
    if (converged)
    {
      /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
      if (scale2)
      {
        N_VDiv(xcor, s2, xcor);
        SUNCheckLastErr();
      }

      if (preOnRight)
      {
        status = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;
          return (LASTFLAG(S));
        }
      }
      else
      {
        N_VScale(ONE, xcor, vtemp);
        SUNCheckLastErr();
      }

      /* Add vtemp to initial x to get final solution x, and return */
      if (*zeroguess)
      {
        N_VScale(ONE, vtemp, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, ONE, vtemp, x);
        SUNCheckLastErr();
      }

      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUN_SUCCESS;
      return (LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart */
    if (ntries == max_restarts) { break; }

    /* Construct last column of Q in yg */
    s_product = ONE;
    for (i = krydim; i > 0; i--)
    {
      yg[i] = s_product * givens[2 * i - 2];
      s_product *= givens[2 * i - 1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg */
    r_norm *= s_product;
    for (i = 0; i <= krydim; i++) { yg[i] *= r_norm; }
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart */
    for (k = 0; k <= krydim; k++)
    {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, V[0]));
  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta)
  {
    /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
    if (scale2)
    {
      N_VDiv(xcor, s2, xcor);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      status = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, xcor, vtemp);
      SUNCheckLastErr();
    }

    /* Add vtemp to initial x to get final solution x, and return */
    if (*zeroguess)
    {
      N_VScale(ONE, vtemp, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, ONE, vtemp, x);
      SUNCheckLastErr();
    }

    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;
    return (LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return (LASTFLAG(S));
}